

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_stream_destroy(cubeb_stream_conflict *stm)

{
  pa_mainloop_api *ppVar1;
  long *in_RDI;
  
  stream_cork(stm,(cork_state)((ulong)in_RDI >> 0x20));
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  if (in_RDI[2] != 0) {
    if (in_RDI[6] != 0) {
      ppVar1 = (*cubeb_pa_threaded_mainloop_get_api)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
      (*ppVar1->time_free)((pa_time_event *)in_RDI[6]);
    }
    (*cubeb_pa_stream_set_state_callback)
              ((pa_stream *)in_RDI[2],(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_write_callback)
              ((pa_stream *)in_RDI[2],(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)((pa_stream *)in_RDI[2]);
    (*cubeb_pa_stream_unref)((pa_stream *)in_RDI[2]);
  }
  if (in_RDI[3] != 0) {
    (*cubeb_pa_stream_set_state_callback)
              ((pa_stream *)in_RDI[3],(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_read_callback)
              ((pa_stream *)in_RDI[3],(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)((pa_stream *)in_RDI[3]);
    (*cubeb_pa_stream_unref)((pa_stream *)in_RDI[3]);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Cubeb stream (%p) destroyed successfully.\n","cubeb_pulse.c",0x405,in_RDI);
  }
  free(in_RDI);
  return;
}

Assistant:

static void
pulse_stream_destroy(cubeb_stream * stm)
{
  stream_cork(stm, CORK);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (stm->output_stream) {

    if (stm->drain_timer) {
      /* there's no pa_rttime_free, so use this instead. */
      WRAP(pa_threaded_mainloop_get_api)(stm->context->mainloop)->time_free(stm->drain_timer);
    }

    WRAP(pa_stream_set_state_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_set_write_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->output_stream);
    WRAP(pa_stream_unref)(stm->output_stream);
  }

  if (stm->input_stream) {
    WRAP(pa_stream_set_state_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_set_read_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->input_stream);
    WRAP(pa_stream_unref)(stm->input_stream);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  LOG("Cubeb stream (%p) destroyed successfully.", stm);
  free(stm);
}